

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::
int_writer<__int128>
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this,
          buffer_appender<char> output,locale_ref loc,__int128 value,basic_format_specs<char> *s)

{
  long *plVar1;
  long lVar2;
  undefined1 value_00 [16];
  bool bVar3;
  detail *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar4;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_R9;
  in_RDI[5] = in_R8;
  in_RDI[4] = in_RCX;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  value_00[6] = in_stack_ffffffffffffff8e;
  value_00._0_6_ = in_stack_ffffffffffffff88;
  value_00[7] = in_stack_ffffffffffffff8f;
  value_00._8_8_ = in_RDI;
  bVar3 = is_negative<__int128,_0>(in_RCX,(__int128)value_00);
  if (bVar3) {
    *(undefined1 *)(in_RDI + 6) = 0x2d;
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
    plVar1 = in_RDI + 4;
    lVar2 = *plVar1;
    *plVar1 = -*plVar1;
    in_RDI[5] = -(ulong)(lVar2 != 0) - in_RDI[5];
  }
  else if (((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 1))
  {
    uVar4 = 0x2b;
    if ((*(byte *)(in_RDI[2] + 9) >> 4 & 7) != 2) {
      uVar4 = 0x20;
    }
    *(undefined1 *)(in_RDI + 6) = uVar4;
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }